

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O0

void m256v_mult_row(m256v *M,int r,uint8_t alpha)

{
  byte bVar1;
  uint8_t val;
  int iVar2;
  int iVar3;
  uint8_t in_DL;
  undefined4 in_ESI;
  long in_RDI;
  uint8_t v;
  int j;
  uint8_t log_alpha;
  long in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  int r_00;
  undefined2 in_stack_fffffffffffffff0;
  undefined4 uVar4;
  
  if (in_DL == '\0') {
    m256v_clear_row((m256v *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  }
  else {
    iVar2 = gf256_log(in_DL);
    bVar1 = (byte)iVar2;
    iVar2 = 0;
    while (iVar2 < *(int *)(in_RDI + 4)) {
      val = m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                         (int)in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe8 = CONCAT13(val,(int3)in_stack_ffffffffffffffe8);
      r_00 = iVar2;
      uVar4 = in_ESI;
      if (val != '\0') {
        in_stack_ffffffffffffffd8 = in_RDI;
        iVar3 = gf256_log(val);
        gf256_exp(iVar3 + (uint)bVar1);
        m256v_set_el((m256v *)CONCAT44(uVar4,CONCAT13(in_DL,CONCAT12(bVar1,in_stack_fffffffffffffff0
                                                                    ))),r_00,
                     in_stack_ffffffffffffffe8,(uint8_t)((uint)iVar2 >> 0x18));
        in_stack_ffffffffffffffe0 = in_ESI;
        in_stack_ffffffffffffffe4 = iVar2;
      }
      in_ESI = uVar4;
      iVar2 = r_00 + 1;
    }
  }
  return;
}

Assistant:

void m256v_mult_row(m256v* M, int r, uint8_t alpha)
{
	/* Special case:  Zero multiplier */
	if (alpha == 0) {
		m256v_clear_row(M, r);
		return;
	}

	/* General case:  Nonzero alpha */
	const uint8_t log_alpha = flog(alpha);
	for (int j = 0; j < M->n_col; ++j) {
		uint8_t v = get_el(M, r, j);
		if (v != 0) {
			set_el(M, r, j, fexp(flog(v) + log_alpha));
		}
	}
}